

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::UMdivideMOD(Forth *this)

{
  uint uVar1;
  uint valueHi;
  anon_union_8_4_a234c5df_for_data_ local_68;
  DCell reminder;
  DCell quotent;
  DCell d1;
  allocator<char> local_39;
  string local_38;
  anon_union_8_4_a234c5df_for_data_ local_18;
  DCell n1;
  Forth *this_local;
  
  n1.data_ = (anon_union_8_4_a234c5df_for_data_)this;
  requireDStackDepth(this,3,"UM/MOD");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  DCell::DCell((DCell *)&local_18.Cells,(ulong)uVar1);
  ForthStack<unsigned_int>::pop(&this->dStack);
  if (local_18.Cells.lo == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"UM/MOD: zero divisor",&local_39);
    throwCppExceptionMessage(this,&local_38,errorDivisionByZero);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack,1);
  valueHi = ForthStack<unsigned_int>::getTop(&this->dStack,0);
  DCell::DCell(&quotent,uVar1,valueHi);
  DCell::DCell(&reminder,(ulong)quotent.data_ / CONCAT44(local_18.Cells.hi,local_18.Cells.lo));
  ForthStack<unsigned_int>::setTop(&this->dStack,0,reminder.data_.Cells.lo);
  DCell::DCell((DCell *)&local_68.Cells,
               (ulong)quotent.data_ % CONCAT44(local_18.Cells.hi,local_18.Cells.lo));
  ForthStack<unsigned_int>::setTop(&this->dStack,1,local_68.Cells.lo);
  return;
}

Assistant:

void UMdivideMOD(){
			REQUIRE_DSTACK_DEPTH(3, "UM/MOD");
			DCell n1(dStack.getTop()); dStack.pop();
			RUNTIME_ERROR_IF(n1.data_.Cells.lo == 0, "UM/MOD: zero divisor", errorDivisionByZero);
			DCell d1(dStack.getTop(1),dStack.getTop(0));
			DCell quotent(d1.data_.Dcells / n1.data_.Dcells); // n3
			dStack.setTop(0, quotent.data_.Cells.lo);
			DCell reminder(d1.data_.Dcells % n1.data_.Dcells); // n2
			dStack.setTop(1, reminder.data_.Cells.lo);
		}